

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::Dispose_<kj::Array<char>,_false>::destruct(void *ptr)

{
  void *ptr_local;
  
  dtor<kj::Array<char>>((Array<char> *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }